

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

char * google::protobuf::internal::WireFormat::_InternalParseAndMergeField
                 (Message *msg,char *ptr,ParseContext *ctx,uint64_t tag,Reflection *reflection,
                 FieldDescriptor *field)

{
  anon_class_32_4_91646d40 add;
  FieldDescriptor *pFVar1;
  Reflection *tag_00;
  bool bVar2;
  WireType WVar3;
  Type TVar4;
  WireType WVar5;
  Syntax SVar6;
  int32_t value_15;
  uint value_16;
  int iVar7;
  UnknownFieldSet *pUVar8;
  char *pcVar9;
  RepeatedField<int> *pRVar10;
  RepeatedField<long> *pRVar11;
  RepeatedField<unsigned_int> *pRVar12;
  RepeatedField<unsigned_long> *pRVar13;
  RepeatedField<float> *object;
  RepeatedField<double> *object_00;
  RepeatedField<bool> *object_01;
  FileDescriptor *this;
  LogMessage *other;
  int64_t value_17;
  unsigned_long value_18;
  long value_19;
  char *pcVar14;
  Data *pDVar15;
  float value_20;
  double value_21;
  MessageLite *local_1a0;
  Message *sub_message_1;
  Message *sub_message;
  string local_170;
  undefined4 local_14c;
  undefined1 local_148 [8];
  string value_14;
  int size;
  uint32_t value_13;
  double value_12;
  float value_11;
  int64_t value_10;
  int32_t value_9;
  uint64_t value_8;
  uint32_t value_7;
  int64_t value_6;
  uint64_t uStack_e0;
  int32_t value_5;
  uint64_t value_4;
  unsigned_long uStack_d0;
  uint32_t value_3;
  uint64_t value_2;
  unsigned_long uStack_c0;
  uint32_t value_1;
  uint64_t value;
  bool strict_utf8_check;
  bool utf8_check;
  LogMessage local_a8;
  RepeatedField<int> *local_70;
  RepeatedField<int> *local_68;
  FieldDescriptor *local_60;
  char *local_58;
  byte local_49;
  RepeatedField<int> *pRStack_48;
  bool open_enum;
  RepeatedField<int> *rep_enum;
  FieldDescriptor *field_local;
  Reflection *reflection_local;
  uint64_t tag_local;
  ParseContext *ctx_local;
  char *ptr_local;
  Message *msg_local;
  
  rep_enum = (RepeatedField<int> *)field;
  field_local = (FieldDescriptor *)reflection;
  reflection_local = (Reflection *)tag;
  tag_local = (uint64_t)ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)msg;
  if (field == (FieldDescriptor *)0x0) {
    pUVar8 = Reflection::MutableUnknownFields(reflection,msg);
    pcVar9 = UnknownFieldParse(tag,pUVar8,(char *)ctx_local,(ParseContext *)tag_local);
    return pcVar9;
  }
  WVar3 = WireFormatLite::GetTagWireType((uint32_t)tag);
  TVar4 = FieldDescriptor::type((FieldDescriptor *)rep_enum);
  WVar5 = WireTypeForFieldType(TVar4);
  if (WVar3 != WVar5) {
    bVar2 = FieldDescriptor::is_packable((FieldDescriptor *)rep_enum);
    if ((!bVar2) ||
       (WVar3 = WireFormatLite::GetTagWireType((uint32_t)reflection_local),
       WVar3 != WIRETYPE_LENGTH_DELIMITED)) {
      tag_00 = reflection_local;
      pUVar8 = Reflection::MutableUnknownFields((Reflection *)field_local,(Message *)ptr_local);
      pcVar9 = UnknownFieldParse((uint64_t)tag_00,pUVar8,(char *)ctx_local,(ParseContext *)tag_local
                                );
      return pcVar9;
    }
    TVar4 = FieldDescriptor::type((FieldDescriptor *)rep_enum);
    switch(TVar4) {
    case TYPE_DOUBLE:
      object_00 = Reflection::MutableRepeatedFieldInternal<double>
                            ((Reflection *)field_local,(Message *)ptr_local,
                             (FieldDescriptor *)rep_enum);
      pcVar9 = PackedDoubleParser(object_00,(char *)ctx_local,(ParseContext *)tag_local);
      return pcVar9;
    case TYPE_FLOAT:
      object = Reflection::MutableRepeatedFieldInternal<float>
                         ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum
                         );
      pcVar9 = PackedFloatParser(object,(char *)ctx_local,(ParseContext *)tag_local);
      return pcVar9;
    case TYPE_INT64:
      pRVar11 = Reflection::MutableRepeatedFieldInternal<long>
                          ((Reflection *)field_local,(Message *)ptr_local,
                           (FieldDescriptor *)rep_enum);
      pcVar9 = PackedInt64Parser(pRVar11,(char *)ctx_local,(ParseContext *)tag_local);
      return pcVar9;
    case TYPE_UINT64:
      pRVar13 = Reflection::MutableRepeatedFieldInternal<unsigned_long>
                          ((Reflection *)field_local,(Message *)ptr_local,
                           (FieldDescriptor *)rep_enum);
      pcVar9 = PackedUInt64Parser(pRVar13,(char *)ctx_local,(ParseContext *)tag_local);
      return pcVar9;
    case TYPE_INT32:
      pRVar10 = Reflection::MutableRepeatedFieldInternal<int>
                          ((Reflection *)field_local,(Message *)ptr_local,
                           (FieldDescriptor *)rep_enum);
      pcVar9 = PackedInt32Parser(pRVar10,(char *)ctx_local,(ParseContext *)tag_local);
      return pcVar9;
    case TYPE_FIXED64:
      pRVar13 = Reflection::MutableRepeatedFieldInternal<unsigned_long>
                          ((Reflection *)field_local,(Message *)ptr_local,
                           (FieldDescriptor *)rep_enum);
      pcVar9 = PackedFixed64Parser(pRVar13,(char *)ctx_local,(ParseContext *)tag_local);
      return pcVar9;
    case TYPE_FIXED32:
      pRVar12 = Reflection::MutableRepeatedFieldInternal<unsigned_int>
                          ((Reflection *)field_local,(Message *)ptr_local,
                           (FieldDescriptor *)rep_enum);
      pcVar9 = PackedFixed32Parser(pRVar12,(char *)ctx_local,(ParseContext *)tag_local);
      return pcVar9;
    case TYPE_BOOL:
      object_01 = Reflection::MutableRepeatedFieldInternal<bool>
                            ((Reflection *)field_local,(Message *)ptr_local,
                             (FieldDescriptor *)rep_enum);
      pcVar9 = PackedBoolParser(object_01,(char *)ctx_local,(ParseContext *)tag_local);
      return pcVar9;
    case TYPE_STRING:
    case TYPE_GROUP:
    case TYPE_MESSAGE:
    case TYPE_BYTES:
      LogMessage::LogMessage
                (&local_a8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
                 ,0x372);
      other = LogMessage::operator<<(&local_a8,"Can\'t reach");
      LogFinisher::operator=((LogFinisher *)((long)&value + 3),other);
      LogMessage::~LogMessage(&local_a8);
      return (char *)0x0;
    case TYPE_UINT32:
      pRVar12 = Reflection::MutableRepeatedFieldInternal<unsigned_int>
                          ((Reflection *)field_local,(Message *)ptr_local,
                           (FieldDescriptor *)rep_enum);
      pcVar9 = PackedUInt32Parser(pRVar12,(char *)ctx_local,(ParseContext *)tag_local);
      return pcVar9;
    case TYPE_ENUM:
      pRStack_48 = Reflection::MutableRepeatedFieldInternal<int>
                             ((Reflection *)field_local,(Message *)ptr_local,
                              (FieldDescriptor *)rep_enum);
      local_49 = 0;
      this = FieldDescriptor::file((FieldDescriptor *)rep_enum);
      SVar6 = FileDescriptor::syntax(this);
      if ((SVar6 != SYNTAX_PROTO3) && ((local_49 & 1) == 0)) {
        local_70 = pRStack_48;
        local_68 = rep_enum;
        local_60 = field_local;
        local_58 = ptr_local;
        add.field = (FieldDescriptor *)rep_enum;
        add.rep_enum = pRStack_48;
        add.reflection = (Reflection *)field_local;
        add.msg = (Message *)ptr_local;
        pcVar9 = EpsCopyInputStream::
                 ReadPackedVarint<google::protobuf::internal::WireFormat::_InternalParseAndMergeField(google::protobuf::Message*,char_const*,google::protobuf::internal::ParseContext*,unsigned_long,google::protobuf::Reflection_const*,google::protobuf::FieldDescriptor_const*)::__0>
                           ((EpsCopyInputStream *)tag_local,(char *)ctx_local,add);
        return pcVar9;
      }
      pcVar9 = PackedEnumParser(pRStack_48,(char *)ctx_local,(ParseContext *)tag_local);
      return pcVar9;
    case TYPE_SFIXED32:
      pRVar10 = Reflection::MutableRepeatedFieldInternal<int>
                          ((Reflection *)field_local,(Message *)ptr_local,
                           (FieldDescriptor *)rep_enum);
      pcVar9 = PackedSFixed32Parser(pRVar10,(char *)ctx_local,(ParseContext *)tag_local);
      return pcVar9;
    case TYPE_SFIXED64:
      pRVar11 = Reflection::MutableRepeatedFieldInternal<long>
                          ((Reflection *)field_local,(Message *)ptr_local,
                           (FieldDescriptor *)rep_enum);
      pcVar9 = PackedSFixed64Parser(pRVar11,(char *)ctx_local,(ParseContext *)tag_local);
      return pcVar9;
    case TYPE_SINT32:
      pRVar10 = Reflection::MutableRepeatedFieldInternal<int>
                          ((Reflection *)field_local,(Message *)ptr_local,
                           (FieldDescriptor *)rep_enum);
      pcVar9 = PackedSInt32Parser(pRVar10,(char *)ctx_local,(ParseContext *)tag_local);
      return pcVar9;
    case MAX_TYPE:
      pRVar11 = Reflection::MutableRepeatedFieldInternal<long>
                          ((Reflection *)field_local,(Message *)ptr_local,
                           (FieldDescriptor *)rep_enum);
      pcVar9 = PackedSInt64Parser(pRVar11,(char *)ctx_local,(ParseContext *)tag_local);
      return pcVar9;
    }
  }
  value._2_1_ = 0;
  value._1_1_ = 0;
  TVar4 = FieldDescriptor::type((FieldDescriptor *)rep_enum);
  switch(TVar4) {
  case TYPE_DOUBLE:
    value_21 = UnalignedLoad<double>((char *)ctx_local);
    ctx_local = (ParseContext *)&(ctx_local->super_EpsCopyInputStream).buffer_end_;
    bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)rep_enum);
    if (bVar2) {
      Reflection::AddDouble
                ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,value_21
                );
    }
    else {
      Reflection::SetDouble
                ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,value_21
                );
    }
    msg_local = (Message *)ctx_local;
    break;
  case TYPE_FLOAT:
    value_20 = UnalignedLoad<float>((char *)ctx_local);
    ctx_local = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 4);
    bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)rep_enum);
    if (bVar2) {
      Reflection::AddFloat
                ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,value_20
                );
    }
    else {
      Reflection::SetFloat
                ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,value_20
                );
    }
    msg_local = (Message *)ctx_local;
    break;
  case TYPE_INT64:
    ctx_local = (ParseContext *)
                VarintParse<unsigned_long>((char *)ctx_local,&stack0xffffffffffffff30);
    if (ctx_local == (ParseContext *)0x0) {
      msg_local = (Message *)0x0;
    }
    else {
      bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)rep_enum);
      if (bVar2) {
        Reflection::AddInt64
                  ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,
                   uStack_d0);
      }
      else {
        Reflection::SetInt64
                  ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,
                   uStack_d0);
      }
      msg_local = (Message *)ctx_local;
    }
    break;
  case TYPE_UINT64:
    ctx_local = (ParseContext *)
                VarintParse<unsigned_long>((char *)ctx_local,&stack0xffffffffffffff20);
    if (ctx_local == (ParseContext *)0x0) {
      msg_local = (Message *)0x0;
    }
    else {
      bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)rep_enum);
      if (bVar2) {
        Reflection::AddUInt64
                  ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,
                   uStack_e0);
      }
      else {
        Reflection::SetUInt64
                  ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,
                   uStack_e0);
      }
      msg_local = (Message *)ctx_local;
    }
    break;
  case TYPE_INT32:
    ctx_local = (ParseContext *)
                VarintParse<unsigned_int>((char *)ctx_local,(uint *)((long)&value_2 + 4));
    if (ctx_local == (ParseContext *)0x0) {
      msg_local = (Message *)0x0;
    }
    else {
      bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)rep_enum);
      if (bVar2) {
        Reflection::AddInt32
                  ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,
                   value_2._4_4_);
      }
      else {
        Reflection::SetInt32
                  ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,
                   value_2._4_4_);
      }
      msg_local = (Message *)ctx_local;
    }
    break;
  case TYPE_FIXED64:
    value_18 = UnalignedLoad<unsigned_long>((char *)ctx_local);
    ctx_local = (ParseContext *)&(ctx_local->super_EpsCopyInputStream).buffer_end_;
    bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)rep_enum);
    if (bVar2) {
      Reflection::AddUInt64
                ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,value_18
                );
    }
    else {
      Reflection::SetUInt64
                ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,value_18
                );
    }
    msg_local = (Message *)ctx_local;
    break;
  case TYPE_FIXED32:
    value_16 = UnalignedLoad<unsigned_int>((char *)ctx_local);
    ctx_local = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 4);
    bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)rep_enum);
    if (bVar2) {
      Reflection::AddUInt32
                ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,value_16
                );
    }
    else {
      Reflection::SetUInt32
                ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,value_16
                );
    }
    msg_local = (Message *)ctx_local;
    break;
  case TYPE_BOOL:
    ctx_local = (ParseContext *)
                VarintParse<unsigned_long>((char *)ctx_local,&stack0xffffffffffffff40);
    if (ctx_local == (ParseContext *)0x0) {
      msg_local = (Message *)0x0;
    }
    else {
      bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)rep_enum);
      if (bVar2) {
        Reflection::AddBool((Reflection *)field_local,(Message *)ptr_local,
                            (FieldDescriptor *)rep_enum,uStack_c0 != 0);
      }
      else {
        Reflection::SetBool((Reflection *)field_local,(Message *)ptr_local,
                            (FieldDescriptor *)rep_enum,uStack_c0 != 0);
      }
      msg_local = (Message *)ctx_local;
    }
    break;
  case TYPE_STRING:
    value._2_1_ = 1;
    value._1_1_ = StrictUtf8Check((FieldDescriptor *)rep_enum);
  case TYPE_BYTES:
    value_14.field_2._8_4_ = ReadSize((char **)&ctx_local);
    if (ctx_local == (ParseContext *)0x0) {
      return (char *)0x0;
    }
    std::__cxx11::string::string((string *)local_148);
    ctx_local = (ParseContext *)
                EpsCopyInputStream::ReadString
                          ((EpsCopyInputStream *)tag_local,(char *)ctx_local,value_14.field_2._8_4_,
                           (string *)local_148);
    if (ctx_local == (ParseContext *)0x0) {
      msg_local = (Message *)0x0;
    }
    else {
      if ((value._2_1_ & 1) != 0) {
        if ((value._1_1_ & 1) == 0) {
          pcVar9 = (char *)std::__cxx11::string::data();
          iVar7 = std::__cxx11::string::length();
          FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)rep_enum);
          pcVar14 = (char *)std::__cxx11::string::c_str();
          VerifyUTF8StringNamedField(pcVar9,iVar7,PARSE,pcVar14);
        }
        else {
          pcVar9 = (char *)std::__cxx11::string::data();
          iVar7 = std::__cxx11::string::length();
          FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)rep_enum);
          pcVar14 = (char *)std::__cxx11::string::c_str();
          bVar2 = WireFormatLite::VerifyUtf8String(pcVar9,iVar7,PARSE,pcVar14);
          if (!bVar2) {
            msg_local = (Message *)0x0;
            goto LAB_0073b98a;
          }
        }
      }
      bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)rep_enum);
      pcVar9 = ptr_local;
      pFVar1 = field_local;
      pRVar10 = rep_enum;
      if (bVar2) {
        std::__cxx11::string::string((string *)&local_170,(string *)local_148);
        Reflection::AddString
                  ((Reflection *)pFVar1,(Message *)pcVar9,(FieldDescriptor *)pRVar10,&local_170);
        std::__cxx11::string::~string((string *)&local_170);
      }
      else {
        std::__cxx11::string::string((string *)&sub_message,(string *)local_148);
        Reflection::SetString
                  ((Reflection *)pFVar1,(Message *)pcVar9,(FieldDescriptor *)pRVar10,
                   (string *)&sub_message);
        std::__cxx11::string::~string((string *)&sub_message);
      }
      msg_local = (Message *)ctx_local;
    }
LAB_0073b98a:
    local_14c = 1;
    std::__cxx11::string::~string((string *)local_148);
    break;
  case TYPE_GROUP:
    bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)rep_enum);
    pcVar9 = ptr_local;
    pFVar1 = field_local;
    pRVar10 = rep_enum;
    if (bVar2) {
      pDVar15 = ParseContext::data((ParseContext *)tag_local);
      sub_message_1 =
           Reflection::AddMessage
                     ((Reflection *)pFVar1,(Message *)pcVar9,(FieldDescriptor *)pRVar10,
                      pDVar15->factory);
    }
    else {
      pDVar15 = ParseContext::data((ParseContext *)tag_local);
      sub_message_1 =
           Reflection::MutableMessage
                     ((Reflection *)pFVar1,(Message *)pcVar9,(FieldDescriptor *)pRVar10,
                      pDVar15->factory);
    }
    msg_local = (Message *)
                ParseContext::ParseGroup<google::protobuf::Message>
                          ((ParseContext *)tag_local,sub_message_1,(char *)ctx_local,
                           (uint32_t)reflection_local);
    break;
  case TYPE_MESSAGE:
    bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)rep_enum);
    pcVar9 = ptr_local;
    pFVar1 = field_local;
    pRVar10 = rep_enum;
    if (bVar2) {
      pDVar15 = ParseContext::data((ParseContext *)tag_local);
      local_1a0 = &Reflection::AddMessage
                             ((Reflection *)pFVar1,(Message *)pcVar9,(FieldDescriptor *)pRVar10,
                              pDVar15->factory)->super_MessageLite;
    }
    else {
      pDVar15 = ParseContext::data((ParseContext *)tag_local);
      local_1a0 = &Reflection::MutableMessage
                             ((Reflection *)pFVar1,(Message *)pcVar9,(FieldDescriptor *)pRVar10,
                              pDVar15->factory)->super_MessageLite;
    }
    msg_local = (Message *)
                ParseContext::ParseMessage((ParseContext *)tag_local,local_1a0,(char *)ctx_local);
    break;
  case TYPE_UINT32:
    ctx_local = (ParseContext *)
                VarintParse<unsigned_int>((char *)ctx_local,(uint *)((long)&value_4 + 4));
    if (ctx_local == (ParseContext *)0x0) {
      msg_local = (Message *)0x0;
    }
    else {
      bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)rep_enum);
      if (bVar2) {
        Reflection::AddUInt32
                  ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,
                   value_4._4_4_);
      }
      else {
        Reflection::SetUInt32
                  ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,
                   value_4._4_4_);
      }
      msg_local = (Message *)ctx_local;
    }
    break;
  case TYPE_ENUM:
    ctx_local = (ParseContext *)
                VarintParse<unsigned_int>
                          ((char *)ctx_local,(uint *)(value_14.field_2._M_local_buf + 0xc));
    if (ctx_local == (ParseContext *)0x0) {
      msg_local = (Message *)0x0;
    }
    else {
      bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)rep_enum);
      if (bVar2) {
        Reflection::AddEnumValue
                  ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,
                   value_14.field_2._12_4_);
      }
      else {
        Reflection::SetEnumValue
                  ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,
                   value_14.field_2._12_4_);
      }
      msg_local = (Message *)ctx_local;
    }
    break;
  case TYPE_SFIXED32:
    iVar7 = UnalignedLoad<int>((char *)ctx_local);
    ctx_local = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 4);
    bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)rep_enum);
    if (bVar2) {
      Reflection::AddInt32
                ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,iVar7);
    }
    else {
      Reflection::SetInt32
                ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,iVar7);
    }
    msg_local = (Message *)ctx_local;
    break;
  case TYPE_SFIXED64:
    value_19 = UnalignedLoad<long>((char *)ctx_local);
    ctx_local = (ParseContext *)&(ctx_local->super_EpsCopyInputStream).buffer_end_;
    bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)rep_enum);
    if (bVar2) {
      Reflection::AddInt64
                ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,value_19
                );
    }
    else {
      Reflection::SetInt64
                ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,value_19
                );
    }
    msg_local = (Message *)ctx_local;
    break;
  case TYPE_SINT32:
    value_15 = ReadVarintZigZag32((char **)&ctx_local);
    if (ctx_local == (ParseContext *)0x0) {
      msg_local = (Message *)0x0;
    }
    else {
      bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)rep_enum);
      if (bVar2) {
        Reflection::AddInt32
                  ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,
                   value_15);
      }
      else {
        Reflection::SetInt32
                  ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,
                   value_15);
      }
      msg_local = (Message *)ctx_local;
    }
    break;
  case MAX_TYPE:
    value_17 = ReadVarintZigZag64((char **)&ctx_local);
    if (ctx_local == (ParseContext *)0x0) {
      msg_local = (Message *)0x0;
    }
    else {
      bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)rep_enum);
      if (bVar2) {
        Reflection::AddInt64
                  ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,
                   value_17);
      }
      else {
        Reflection::SetInt64
                  ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,
                   value_17);
      }
      msg_local = (Message *)ctx_local;
    }
    break;
  default:
    msg_local = (Message *)0x0;
  }
  return (char *)msg_local;
}

Assistant:

const char* WireFormat::_InternalParseAndMergeField(
    Message* msg, const char* ptr, internal::ParseContext* ctx, uint64_t tag,
    const Reflection* reflection, const FieldDescriptor* field) {
  if (field == nullptr) {
    // unknown field set parser takes 64bit tags, because message set type ids
    // span the full 32 bit range making the tag span [0, 2^35) range.
    return internal::UnknownFieldParse(
        tag, reflection->MutableUnknownFields(msg), ptr, ctx);
  }
  if (WireFormatLite::GetTagWireType(tag) !=
      WireTypeForFieldType(field->type())) {
    if (field->is_packable() && WireFormatLite::GetTagWireType(tag) ==
                                    WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
      switch (field->type()) {
#define HANDLE_PACKED_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)                   \
  case FieldDescriptor::TYPE_##TYPE: {                                      \
    ptr = internal::Packed##CPPTYPE_METHOD##Parser(                         \
        reflection->MutableRepeatedFieldInternal<CPPTYPE>(msg, field), ptr, \
        ctx);                                                               \
    return ptr;                                                             \
  }

        HANDLE_PACKED_TYPE(INT32, int32_t, Int32)
        HANDLE_PACKED_TYPE(INT64, int64_t, Int64)
        HANDLE_PACKED_TYPE(SINT32, int32_t, SInt32)
        HANDLE_PACKED_TYPE(SINT64, int64_t, SInt64)
        HANDLE_PACKED_TYPE(UINT32, uint32_t, UInt32)
        HANDLE_PACKED_TYPE(UINT64, uint64_t, UInt64)

        HANDLE_PACKED_TYPE(FIXED32, uint32_t, Fixed32)
        HANDLE_PACKED_TYPE(FIXED64, uint64_t, Fixed64)
        HANDLE_PACKED_TYPE(SFIXED32, int32_t, SFixed32)
        HANDLE_PACKED_TYPE(SFIXED64, int64_t, SFixed64)

        HANDLE_PACKED_TYPE(FLOAT, float, Float)
        HANDLE_PACKED_TYPE(DOUBLE, double, Double)

        HANDLE_PACKED_TYPE(BOOL, bool, Bool)
#undef HANDLE_PACKED_TYPE

        case FieldDescriptor::TYPE_ENUM: {
          auto rep_enum =
              reflection->MutableRepeatedFieldInternal<int>(msg, field);
          bool open_enum = false;
          if (field->file()->syntax() == FileDescriptor::SYNTAX_PROTO3 ||
              open_enum) {
            ptr = internal::PackedEnumParser(rep_enum, ptr, ctx);
          } else {
            return ctx->ReadPackedVarint(
                ptr, [rep_enum, field, reflection, msg](uint64_t val) {
                  if (field->enum_type()->FindValueByNumber(val) != nullptr) {
                    rep_enum->Add(val);
                  } else {
                    WriteVarint(field->number(), val,
                                reflection->MutableUnknownFields(msg));
                  }
                });
          }
          return ptr;
        }

        case FieldDescriptor::TYPE_STRING:
        case FieldDescriptor::TYPE_GROUP:
        case FieldDescriptor::TYPE_MESSAGE:
        case FieldDescriptor::TYPE_BYTES:
          GOOGLE_LOG(FATAL) << "Can't reach";
          return nullptr;
      }
    } else {
      // mismatched wiretype;
      return internal::UnknownFieldParse(
          tag, reflection->MutableUnknownFields(msg), ptr, ctx);
    }
  }

  // Non-packed value
  bool utf8_check = false;
  bool strict_utf8_check = false;
  switch (field->type()) {
#define HANDLE_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)        \
  case FieldDescriptor::TYPE_##TYPE: {                    \
    CPPTYPE value;                                        \
    ptr = VarintParse(ptr, &value);                       \
    if (ptr == nullptr) return nullptr;                   \
    if (field->is_repeated()) {                           \
      reflection->Add##CPPTYPE_METHOD(msg, field, value); \
    } else {                                              \
      reflection->Set##CPPTYPE_METHOD(msg, field, value); \
    }                                                     \
    return ptr;                                           \
  }

    HANDLE_TYPE(BOOL, uint64_t, Bool)
    HANDLE_TYPE(INT32, uint32_t, Int32)
    HANDLE_TYPE(INT64, uint64_t, Int64)
    HANDLE_TYPE(UINT32, uint32_t, UInt32)
    HANDLE_TYPE(UINT64, uint64_t, UInt64)

    case FieldDescriptor::TYPE_SINT32: {
      int32_t value = ReadVarintZigZag32(&ptr);
      if (ptr == nullptr) return nullptr;
      if (field->is_repeated()) {
        reflection->AddInt32(msg, field, value);
      } else {
        reflection->SetInt32(msg, field, value);
      }
      return ptr;
    }
    case FieldDescriptor::TYPE_SINT64: {
      int64_t value = ReadVarintZigZag64(&ptr);
      if (ptr == nullptr) return nullptr;
      if (field->is_repeated()) {
        reflection->AddInt64(msg, field, value);
      } else {
        reflection->SetInt64(msg, field, value);
      }
      return ptr;
    }
#undef HANDLE_TYPE
#define HANDLE_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)        \
  case FieldDescriptor::TYPE_##TYPE: {                    \
    CPPTYPE value;                                        \
    value = UnalignedLoad<CPPTYPE>(ptr);                  \
    ptr += sizeof(CPPTYPE);                               \
    if (field->is_repeated()) {                           \
      reflection->Add##CPPTYPE_METHOD(msg, field, value); \
    } else {                                              \
      reflection->Set##CPPTYPE_METHOD(msg, field, value); \
    }                                                     \
    return ptr;                                           \
  }

      HANDLE_TYPE(FIXED32, uint32_t, UInt32)
      HANDLE_TYPE(FIXED64, uint64_t, UInt64)
      HANDLE_TYPE(SFIXED32, int32_t, Int32)
      HANDLE_TYPE(SFIXED64, int64_t, Int64)

      HANDLE_TYPE(FLOAT, float, Float)
      HANDLE_TYPE(DOUBLE, double, Double)

#undef HANDLE_TYPE

    case FieldDescriptor::TYPE_ENUM: {
      uint32_t value;
      ptr = VarintParse(ptr, &value);
      if (ptr == nullptr) return nullptr;
      if (field->is_repeated()) {
        reflection->AddEnumValue(msg, field, value);
      } else {
        reflection->SetEnumValue(msg, field, value);
      }
      return ptr;
    }

    // Handle strings separately so that we can optimize the ctype=CORD case.
    case FieldDescriptor::TYPE_STRING:
      utf8_check = true;
      strict_utf8_check = StrictUtf8Check(field);
      PROTOBUF_FALLTHROUGH_INTENDED;
    case FieldDescriptor::TYPE_BYTES: {
      int size = ReadSize(&ptr);
      if (ptr == nullptr) return nullptr;
      std::string value;
      ptr = ctx->ReadString(ptr, size, &value);
      if (ptr == nullptr) return nullptr;
      if (utf8_check) {
        if (strict_utf8_check) {
          if (!WireFormatLite::VerifyUtf8String(value.data(), value.length(),
                                                WireFormatLite::PARSE,
                                                field->full_name().c_str())) {
            return nullptr;
          }
        } else {
          VerifyUTF8StringNamedField(value.data(), value.length(), PARSE,
                                     field->full_name().c_str());
        }
      }
      if (field->is_repeated()) {
        reflection->AddString(msg, field, std::move(value));
      } else {
        reflection->SetString(msg, field, std::move(value));
      }
      return ptr;
    }

    case FieldDescriptor::TYPE_GROUP: {
      Message* sub_message;
      if (field->is_repeated()) {
        sub_message = reflection->AddMessage(msg, field, ctx->data().factory);
      } else {
        sub_message =
            reflection->MutableMessage(msg, field, ctx->data().factory);
      }

      return ctx->ParseGroup(sub_message, ptr, tag);
    }

    case FieldDescriptor::TYPE_MESSAGE: {
      Message* sub_message;
      if (field->is_repeated()) {
        sub_message = reflection->AddMessage(msg, field, ctx->data().factory);
      } else {
        sub_message =
            reflection->MutableMessage(msg, field, ctx->data().factory);
      }
      return ctx->ParseMessage(sub_message, ptr);
    }
  }

  // GCC 8 complains about control reaching end of non-void function here.
  // Let's keep it happy by returning a nullptr.
  return nullptr;
}